

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::DumpChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  pointer pNVar1;
  long lVar2;
  undefined7 in_register_00000011;
  Node *child;
  pointer this_00;
  ostringstream ss;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    DumpChildrenAscii(this,(ostream *)local_198,indent);
    lVar2 = std::ostream::tellp();
    if (0 < lVar2) {
      std::__cxx11::stringbuf::str();
      StreamWriter<false,_false>::PutString(s,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  else {
    pNVar1 = (this->children).
             super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->children).
                   super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
                   .super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1) {
      DumpBinary(this_00,s);
    }
  }
  return;
}

Assistant:

void FBX::Node::DumpChildren(
    Assimp::StreamWriterLE& s,
    bool binary, int indent
) {
    if (binary) {
        DumpChildrenBinary(s);
    } else {
        std::ostringstream ss;
        DumpChildrenAscii(ss, indent);
        if (ss.tellp() > 0)
            s.PutString(ss.str());
    }
}